

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fingergeometry.cpp
# Opt level: O2

int QtMWidgets::FingerGeometry::touchBounce(void)

{
  int iVar1;
  int iVar2;
  
  if (touchBounce()::bounce == '\0') {
    iVar1 = __cxa_guard_acquire(&touchBounce()::bounce);
    if (iVar1 != 0) {
      iVar2 = height();
      iVar1 = width();
      if (iVar1 < iVar2) {
        iVar1 = iVar2;
      }
      touchBounce::bounce =
           (int)((double)((ulong)((double)iVar1 * 0.2) & 0x8000000000000000 | (ulong)DAT_0018e240) +
                (double)iVar1 * 0.2);
      __cxa_guard_release(&touchBounce()::bounce);
    }
  }
  return touchBounce::bounce;
}

Assistant:

int
FingerGeometry::touchBounce()
{
	static const int bounce = qRound(
		(qreal) qMax( FingerGeometry::height(), FingerGeometry::width() ) * 0.2 );

	return bounce;
}